

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplace_back<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,
          pair<unsigned_long,_unsigned_long> *args)

{
  ulong uVar1;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *p;
  unsigned_long uVar2;
  undefined8 uVar3;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *pSVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  long lVar7;
  long lVar8;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *__src;
  ulong uVar9;
  long lVar10;
  
  __src = (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)
          (*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    uVar2 = args->second;
    *(unsigned_long *)__src = args->first;
    *(unsigned_long *)(__src + 8) = uVar2;
    lVar7 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar7 + 1;
    return (reference)(*(long *)this + (lVar7 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar10 = (long)__src - *(long *)this;
  puVar6 = (unsigned_long *)operator_new(uVar9 << 4);
  uVar2 = args->second;
  *(unsigned_long *)((long)puVar6 + lVar10) = args->first;
  ((unsigned_long *)((long)puVar6 + lVar10))[1] = uVar2;
  p = *(SmallVectorBase<std::pair<unsigned_long,unsigned_long>> **)this;
  lVar7 = *(long *)(this + 8) * 0x10;
  pSVar4 = p;
  puVar5 = puVar6;
  if (p + (lVar7 - (long)__src) == (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)0x0) {
    if (*(long *)(this + 8) != 0) {
      lVar8 = 0;
      do {
        uVar3 = *(undefined8 *)(p + lVar8 + 8);
        *(undefined8 *)((long)puVar6 + lVar8) = *(undefined8 *)(p + lVar8);
        ((undefined8 *)((long)puVar6 + lVar8))[1] = uVar3;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 != lVar8);
    }
  }
  else {
    for (; pSVar4 != __src; pSVar4 = pSVar4 + 0x10) {
      uVar2 = *(unsigned_long *)(pSVar4 + 8);
      *puVar5 = *(unsigned_long *)pSVar4;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
    memcpy((void *)((long)puVar6 + lVar10 + 0x10),__src,
           ((ulong)(p + (lVar7 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(unsigned_long **)this = puVar6;
  return (reference)((long)puVar6 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }